

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::ProgramInterfaceQueryTests::init
          (ProgramInterfaceQueryTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *node;
  TestCase *pTVar1;
  TestCaseGroup *pTVar2;
  BufferBackedBlockInterfaceTestGroup *pBVar3;
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "buffer_limited_query","Queries limited by the buffer size");
  tcu::TestNode::addChild((TestNode *)this,node);
  pTVar1 = (TestCase *)operator_new(0x78);
  gles31::TestCase::TestCase
            (pTVar1,(this->super_TestCaseGroup).m_context,"resource_name_query",
             "Test GetProgramResourceName with too small a buffer");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e5b570;
  tcu::TestNode::addChild(node,(TestNode *)pTVar1);
  pTVar1 = (TestCase *)operator_new(0x78);
  gles31::TestCase::TestCase
            (pTVar1,(this->super_TestCaseGroup).m_context,"resource_query",
             "Test GetProgramResourceiv with too small a buffer");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e5b640;
  tcu::TestNode::addChild(node,(TestNode *)pTVar1);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"uniform","Uniform interace");
  (pTVar2->super_TestCaseGroup).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e5b720;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pBVar3 = (BufferBackedBlockInterfaceTestGroup *)operator_new(0x80);
  Functional::anon_unknown_0::BufferBackedBlockInterfaceTestGroup::
  BufferBackedBlockInterfaceTestGroup(pBVar3,(this->super_TestCaseGroup).m_context,STORAGE_UNIFORM);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar3);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"atomic_counter_buffer",
             "Atomic counter buffer");
  (pTVar2->super_TestCaseGroup).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e5bdd8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"program_input","Program input");
  (pTVar2->super_TestCaseGroup).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e5c050;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"program_output","Program output");
  (pTVar2->super_TestCaseGroup).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e5c218;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"transform_feedback_varying",
             "Transform feedback varyings");
  (pTVar2->super_TestCaseGroup).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e5c268;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"buffer_variable","Buffer variable");
  (pTVar2->super_TestCaseGroup).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e5c3d8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pBVar3 = (BufferBackedBlockInterfaceTestGroup *)operator_new(0x80);
  Functional::anon_unknown_0::BufferBackedBlockInterfaceTestGroup::
  BufferBackedBlockInterfaceTestGroup(pBVar3,(this->super_TestCaseGroup).m_context,STORAGE_BUFFER);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar3);
  return extraout_EAX;
}

Assistant:

void ProgramInterfaceQueryTests::init (void)
{
	// Misc queries

	// .buffer_limited_query
	{
		tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "buffer_limited_query", "Queries limited by the buffer size");

		addChild(group);

		group->addChild(new ResourceNameBufferLimitCase(m_context, "resource_name_query", "Test GetProgramResourceName with too small a buffer"));
		group->addChild(new ResourceQueryBufferLimitCase(m_context, "resource_query", "Test GetProgramResourceiv with too small a buffer"));
	}

	// Interfaces

	// .uniform
	addChild(new UniformInterfaceTestGroup(m_context));

	// .uniform_block
	addChild(new BufferBackedBlockInterfaceTestGroup(m_context, glu::STORAGE_UNIFORM));

	// .atomic_counter_buffer
	addChild(new AtomicCounterTestGroup(m_context));

	// .program_input
	addChild(new ProgramInputTestGroup(m_context));

	// .program_output
	addChild(new ProgramOutputTestGroup(m_context));

	// .transform_feedback_varying
	addChild(new TransformFeedbackVaryingTestGroup(m_context));

	// .buffer_variable
	addChild(new BufferVariableTestGroup(m_context));

	// .shader_storage_block
	addChild(new BufferBackedBlockInterfaceTestGroup(m_context, glu::STORAGE_BUFFER));
}